

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O3

string * base64Encode_abi_cxx11_
                   (string *__return_storage_ptr__,vector<char,_std::allocator<char>_> *data)

{
  ulong uVar1;
  char cVar2;
  ulong local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_40 = 1;
  while( true ) {
    uVar1 = *(long *)(data + 8) - *(long *)data;
    cVar2 = (char)__return_storage_ptr__;
    if (uVar1 < local_40 + 2) break;
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    local_40 = local_40 + 3;
    std::__cxx11::string::push_back(cVar2);
  }
  if (local_40 + 1 == uVar1) {
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
  }
  else if (local_40 == uVar1) {
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
  }
  else if (local_40 - 1 != uVar1) {
    __assert_fail("i == data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/base64.h"
                  ,0x39,"std::string base64Encode(std::vector<char> &)");
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string base64Encode(std::vector<char>& data) {
  std::string ret;
  size_t i = 0;

  const char* alphabet = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         "abcdefghijklmnopqrstuvwxyz"
                         "0123456789+/";

  while (i + 3 <= data.size()) {
    uint32_t bits = (((uint32_t)(uint8_t)data[i + 0]) << 16) |
                    (((uint32_t)(uint8_t)data[i + 1]) << 8) |
                    (((uint32_t)(uint8_t)data[i + 2]) << 0);
    ret += alphabet[(bits >> 18) & 0x3f];
    ret += alphabet[(bits >> 12) & 0x3f];
    ret += alphabet[(bits >> 6) & 0x3f];
    ret += alphabet[(bits >> 0) & 0x3f];
    i += 3;
  }

  if (i + 2 == data.size()) {
    uint32_t bits = (((uint32_t)(uint8_t)data[i + 0]) << 8) |
                    (((uint32_t)(uint8_t)data[i + 1]) << 0);
    ret += alphabet[(bits >> 10) & 0x3f];
    ret += alphabet[(bits >> 4) & 0x3f];
    ret += alphabet[(bits << 2) & 0x3f];
    ret += '=';
  } else if (i + 1 == data.size()) {
    uint32_t bits = (uint32_t)(uint8_t)data[i + 0];
    ret += alphabet[(bits >> 2) & 0x3f];
    ret += alphabet[(bits << 4) & 0x3f];
    ret += '=';
    ret += '=';
  } else {
    assert(i == data.size());
  }

  return ret;
}